

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O1

void CompiledMixedType<unsigned_long_long,long>(void)

{
  ulong uVar1;
  ulong uVar2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar3;
  uint64_t tmp;
  unsigned_long_long ret;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_38;
  long local_30 [2];
  
  local_38.m_int = 0;
  operator*(0,(SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x0);
  local_38.m_int = 1;
  local_30[0] = 1;
  local_30[1] = 0;
  DivisionHelper<unsigned_long_long,long,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38.m_int,local_30,(unsigned_long_long *)(local_30 + 1));
  operator/(1,local_38);
  local_30[0] = 1;
  DivisionHelper<unsigned_long_long,long,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38.m_int,local_30,&local_38.m_int);
  local_30[0] = 1;
  DivisionHelper<unsigned_long_long,long,1>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_38.m_int,local_30,&local_38.m_int);
  if (((local_38.m_int != 0xffffffffffffffff) && (local_38.m_int != 0xffffffffffffffff)) &&
     (uVar1 = local_38.m_int + 1, uVar2 = local_38.m_int + 2, local_38.m_int = uVar1, uVar1 <= uVar2
     )) {
    local_38.m_int = 0;
    SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
    ::operator<<((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                  *)&local_38,1);
    SVar3 = SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator<<((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                          *)&local_38,
                         (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x1);
    operator<<(SVar3.m_int,
               (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )0x1);
    SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
    ::operator<<=((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                   *)&local_38,1);
    SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
    ::operator<<=((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                   *)&local_38,
                  (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   )0x1);
    SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
    ::operator>>((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                  *)&local_38,1);
    SVar3 = SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ::operator>>((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                          *)&local_38,
                         (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          )0x1);
    operator>>(SVar3.m_int,
               (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )0x1);
    SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
    ::operator>>=((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                   *)&local_38,1);
    SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
    ::operator>>=((SafeInt<unsigned_long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                   *)&local_38,
                  (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   )0x1);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}